

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O0

void runOnce<long,disruptor::MultiThreadedStrategy,disruptor::BusySpinStrategy>(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  rep rVar8;
  ulong uVar9;
  type diff;
  time_point end_time;
  int64_t cursor;
  int i_4;
  int i_3;
  int i_2;
  time_point start_time;
  thread *tp;
  int i_1;
  thread *tc;
  int i;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0> s;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> seqs;
  Sequence *sequences;
  memory_order __b_1;
  memory_order __b;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0>
  *in_stack_fffffffffffffb68;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0>
  *in_stack_fffffffffffffb70;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0> *this;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffb78;
  ulong *puVar10;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *in_stack_fffffffffffffb80;
  size_t in_stack_fffffffffffffb88;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0>
  *in_stack_fffffffffffffb90;
  ulong *puVar11;
  reference_wrapper<disruptor::Sequence> *in_stack_fffffffffffffb98;
  ulong *puVar12;
  reference_wrapper<disruptor::Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0>_>
  *in_stack_fffffffffffffba0;
  _func_void_Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0>_ptr_Sequence_ptr
  *in_stack_fffffffffffffba8;
  thread *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbc8;
  ulong *local_368;
  ulong *local_338;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0> *local_308;
  duration<long,_std::ratio<1L,_1000L>_> local_2e0;
  string local_2d8 [32];
  string local_2b8 [32];
  rep local_298;
  undefined8 local_290;
  int64_t local_288;
  int local_280;
  int local_27c;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0> *local_278;
  int local_264;
  undefined8 local_260;
  ulong *local_258;
  Sequence *local_250;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0> *local_248;
  int local_234;
  ulong *local_230;
  int64_t *local_228;
  int local_21c;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0> *local_40;
  __atomic_base<long> local_38;
  memory_order local_30;
  undefined4 local_2c;
  atomic<long> *local_28;
  __int_type local_20;
  memory_order local_18;
  int local_14;
  __atomic_base<long> local_10;
  atomic<long> *local_8;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Staring run ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_8 = &sum;
  local_10._M_i = 0;
  local_14 = 5;
  local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_20 = local_10._M_i;
  if ((local_14 != 3) && (local_14 == 5)) {
    LOCK();
    UNLOCK();
  }
  sum.super___atomic_base<long>._M_i = (__atomic_base<long>)(__atomic_base<long>)local_10._M_i;
  uVar5 = (ulong)nc;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar6 = SUB168(auVar1 * ZEXT816(0x78),0);
  if (SUB168(auVar1 * ZEXT816(0x78),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  local_40 = (Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0> *)
             operator_new__(uVar6);
  if (uVar5 != 0) {
    local_308 = local_40;
    do {
      disruptor::Sequence::Sequence
                ((Sequence *)in_stack_fffffffffffffb70,(int64_t)in_stack_fffffffffffffb68);
      local_308 = (Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0>
                   *)((local_308->cursor_).padding1_ + 3);
    } while (local_308 !=
             (Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0> *)
             ((&local_40->cursor_)[uVar5 - 1].padding1_ + 3));
  }
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::vector
            ((vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)0x1678c6);
  disruptor::Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0>::
  Sequencer(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  for (local_21c = 0; local_21c < nc; local_21c = local_21c + 1) {
    local_228 = (&local_40->cursor_)[(long)local_21c + -1].padding1_ + 3;
    std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::push_back
              ((vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
               in_stack_fffffffffffffb70,(value_type *)in_stack_fffffffffffffb68);
  }
  disruptor::Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0>::
  set_gating_sequences
            (in_stack_fffffffffffffb70,
             (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
             in_stack_fffffffffffffb68);
  uVar5 = (ulong)nc;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  uVar9 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar9 = 0xffffffffffffffff;
  }
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  local_230 = (ulong *)operator_new__(uVar9);
  *local_230 = uVar5;
  local_230 = local_230 + 1;
  if (uVar5 != 0) {
    local_338 = local_230;
    do {
      std::thread::thread((thread *)0x167a59);
      local_338 = local_338 + 1;
    } while (local_338 != local_230 + uVar5);
  }
  for (local_234 = 0; local_234 < nc; local_234 = local_234 + 1) {
    local_248 = (Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0> *
                )std::
                 ref<disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::BusySpinStrategy,0>>
                           (in_stack_fffffffffffffb68);
    local_250 = (Sequence *)std::ref<disruptor::Sequence>((Sequence *)in_stack_fffffffffffffb68);
    std::thread::
    thread<void(&)(disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::BusySpinStrategy,0>&,disruptor::Sequence&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::BusySpinStrategy,0>>,std::reference_wrapper<disruptor::Sequence>,void>
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
               in_stack_fffffffffffffb98);
    std::thread::operator=((thread *)in_stack_fffffffffffffb70,(thread *)in_stack_fffffffffffffb68);
    std::thread::~thread((thread *)0x167b38);
  }
  uVar5 = (ulong)np;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar5;
  uVar6 = SUB168(auVar3 * ZEXT816(8),0);
  uVar9 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar9 = 0xffffffffffffffff;
  }
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  local_258 = (ulong *)operator_new__(uVar9);
  *local_258 = uVar5;
  local_258 = local_258 + 1;
  if (uVar5 != 0) {
    local_368 = local_258;
    do {
      std::thread::thread((thread *)0x167bf3);
      local_368 = local_368 + 1;
    } while (local_368 != local_258 + uVar5);
  }
  local_260 = std::chrono::_V2::system_clock::now();
  for (local_264 = 0; local_264 < np; local_264 = local_264 + 1) {
    local_278 = (Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0> *
                )std::
                 ref<disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::BusySpinStrategy,0>>
                           (in_stack_fffffffffffffb68);
    std::thread::
    thread<void(&)(disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::BusySpinStrategy,0>&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::BusySpinStrategy,0>>,void>
              (in_stack_fffffffffffffbb0,
               (_func_void_Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0>_ptr
                *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    std::thread::operator=((thread *)in_stack_fffffffffffffb70,(thread *)in_stack_fffffffffffffb68);
    std::thread::~thread((thread *)0x167caf);
  }
  for (local_27c = 0; local_27c < np; local_27c = local_27c + 1) {
    std::thread::join();
  }
  for (local_280 = 0; local_280 < nc; local_280 = local_280 + 1) {
    std::thread::join();
  }
  local_288 = disruptor::
              Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0>::
              GetCursor((Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0>
                         *)0x167d66);
  poVar4 = std::operator<<((ostream *)&std::cout,"\nBatch size: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,delta);
  poVar4 = std::operator<<(poVar4," Ring buffer size: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,RING_BUFFER_SIZE);
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<((ostream *)&std::cout,"Cursor: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_288);
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<((ostream *)&std::cout,"Sum: ");
  local_28 = &sum;
  local_2c = 5;
  local_30 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_38 = sum.super___atomic_base<long>._M_i;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(long)sum.super___atomic_base<long>._M_i);
  poVar4 = std::operator<<(poVar4," Expected sum: ");
  poVar4 = (ostream *)
           std::ostream::operator<<(poVar4,(expectedValue * (expectedValue + 1) * (long)nc) / 2);
  std::operator<<(poVar4,'\n');
  local_290 = std::chrono::_V2::system_clock::now();
  local_298 = (rep)std::chrono::operator-
                             (in_stack_fffffffffffffb78,
                              (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffffb70);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,np);
  poVar4 = std::operator<<(poVar4,"P-");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,nc);
  poVar4 = std::operator<<(poVar4,"C ");
  std::type_info::name((type_info *)&disruptor::MultiThreadedStrategy::typeinfo);
  demangle_abi_cxx11_(in_stack_fffffffffffffbc8);
  poVar4 = std::operator<<(poVar4,local_2b8);
  poVar4 = std::operator<<(poVar4," ");
  std::type_info::name((type_info *)&disruptor::BusySpinStrategy::typeinfo);
  demangle_abi_cxx11_(in_stack_fffffffffffffbc8);
  poVar4 = std::operator<<(poVar4,local_2d8);
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string(local_2b8);
  lVar7 = local_288 * 1000;
  local_2e0.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffb68);
  rVar8 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_2e0);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,lVar7 / rVar8);
  poVar4 = std::operator<<(poVar4," ops/secs");
  std::operator<<(poVar4,"\n\n");
  if (local_230 != (ulong *)0x0) {
    puVar10 = local_230 + -1;
    puVar12 = local_230 + local_230[-1];
    puVar11 = local_230;
    if (local_230 != puVar12) {
      do {
        puVar12 = puVar12 + -1;
        std::thread::~thread((thread *)0x168211);
      } while (puVar12 != puVar11);
    }
    operator_delete__(puVar10);
  }
  if (local_258 != (ulong *)0x0) {
    in_stack_fffffffffffffb80 =
         (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)(local_258 + -1);
    puVar10 = local_258 + local_258[-1];
    puVar11 = local_258;
    if (local_258 != puVar10) {
      do {
        puVar10 = puVar10 + -1;
        std::thread::~thread((thread *)0x16827e);
      } while (puVar10 != puVar11);
    }
    operator_delete__(in_stack_fffffffffffffb80);
  }
  this = local_40;
  if (local_40 !=
      (Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0> *)0x0) {
    operator_delete__(local_40);
  }
  disruptor::Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BusySpinStrategy,_0>::
  ~Sequencer(this);
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::~vector
            (in_stack_fffffffffffffb80);
  return;
}

Assistant:

void runOnce() {
  std::cout << "Staring run " << std::endl;

  sum.store(0);

  disruptor::Sequence* sequences = new disruptor::Sequence[nc];

  std::vector<disruptor::Sequence*> seqs;
  disruptor::Sequencer<T, C, W> s(RING_BUFFER_SIZE);

  for (int i = 0; i < nc; ++i) seqs.push_back(&sequences[i]);

  s.set_gating_sequences(seqs);

  std::thread* tc = new std::thread[nc];
  for (int i = 0; i < nc; ++i)
    tc[i] = std::thread(consume<T, C, W>, std::ref(s), std::ref(sequences[i]));

  std::thread* tp = new std::thread[np];

  auto start_time = std::chrono::high_resolution_clock::now();

  for (int i = 0; i < np; ++i)
    tp[i] = std::thread(produce<T, C, W>, std::ref(s));

  // std::this_thread::sleep_for(std::chrono::seconds(3));

  for (int i = 0; i < np; ++i) tp[i].join();
  for (int i = 0; i < nc; ++i) tc[i].join();

  int64_t cursor = s.GetCursor();
  std::cout << "\nBatch size: " << delta
            << " Ring buffer size: " << RING_BUFFER_SIZE << '\n';
  std::cout << "Cursor: " << cursor << '\n';
  std::cout << "Sum: " << sum.load() << " Expected sum: "
            << (expectedValue * (expectedValue + 1) * nc) / 2 << '\n';

  auto end_time = std::chrono::high_resolution_clock::now();
  auto diff = end_time - start_time;

  //std::cout.precision(15);
  std::cout << np << "P-" << nc << "C " << demangle(typeid(C).name()) << " "
            << demangle(typeid(W).name()) << '\n';
  std::cout << (cursor * 1000) /
                   (std::chrono::duration_cast<std::chrono::milliseconds>(diff)
                        .count())
            << " ops/secs"
            << "\n\n";

  delete[] tc;
  delete[] tp;
  delete[] sequences;
}